

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecatDemoCommon.cpp
# Opt level: O3

void PrintCfgSlavesInfo(EC_T_DWORD dwInstanceID,CAtEmLogging *poLog)

{
  EC_T_DWORD EVar1;
  int iVar2;
  uint uVar3;
  EC_T_CHAR *pEVar4;
  char *pcVar5;
  char *pcVar6;
  short sVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  undefined1 auVar12 [16];
  EC_T_CFG_SLAVE_INFO oCfgSlaveInfo;
  
  memset(&oCfgSlaveInfo,0,0xf8);
  CAtEmLogging::LogMsg(poLog,"==================================================");
  CAtEmLogging::LogMsg(poLog,"=== Config slaves ================================");
  CAtEmLogging::LogMsg(poLog,"==================================================");
  sVar7 = 0;
  do {
    iVar2 = emGetCfgSlaveInfo(dwInstanceID,0,sVar7,&oCfgSlaveInfo);
    if (iVar2 != 0) break;
    CAtEmLogging::LogMsg
              (poLog,
               "******************************************************************************");
    CAtEmLogging::LogMsg(poLog,"Slave ID............: 0x%08X",(ulong)oCfgSlaveInfo.dwSlaveId);
    CAtEmLogging::LogMsg(poLog,"Bus AutoInc Address.: 0x%04x",(ulong)oCfgSlaveInfo.wAutoIncAddress);
    CAtEmLogging::LogMsg
              (poLog,"Bus Station Address.: 0x%04x (%4d)",(ulong)oCfgSlaveInfo.wStationAddress);
    EVar1 = oCfgSlaveInfo.dwVendorId;
    pEVar4 = SlaveVendorText(oCfgSlaveInfo.dwVendorId);
    CAtEmLogging::LogMsg(poLog,"Vendor ID...........: 0x%08X = %s",(ulong)EVar1,pEVar4);
    EVar1 = oCfgSlaveInfo.dwProductCode;
    pEVar4 = SlaveProdCodeText(oCfgSlaveInfo.dwVendorId,oCfgSlaveInfo.dwProductCode);
    CAtEmLogging::LogMsg(poLog,"Product Code........: 0x%08X = %s",(ulong)EVar1,pEVar4);
    CAtEmLogging::LogMsg
              (poLog,"Revision............: 0x%08X   Serial Number: %d",
               (ulong)oCfgSlaveInfo.dwRevisionNumber,(ulong)oCfgSlaveInfo.dwSerialNumber);
    if (oCfgSlaveInfo.dwPdSizeIn != 0) {
      CAtEmLogging::LogMsg
                (poLog,"PD IN   Byte.Bit offset: %d.%d   Size: %d bits",
                 (ulong)(oCfgSlaveInfo.dwPdOffsIn >> 3),(ulong)(oCfgSlaveInfo.dwPdOffsIn & 7));
    }
    if (oCfgSlaveInfo.dwPdSizeOut != 0) {
      CAtEmLogging::LogMsg
                (poLog,"PD OUT  Byte.Bit offset: %d.%d   Size: %d bits",
                 (ulong)(oCfgSlaveInfo.dwPdOffsOut >> 3),(ulong)(oCfgSlaveInfo.dwPdOffsOut & 7));
    }
    if (oCfgSlaveInfo.dwPdSizeIn2 != 0) {
      CAtEmLogging::LogMsg
                (poLog,"PD IN2  Byte.Bit offset: %d.%d   Size: %d bits",
                 (ulong)(oCfgSlaveInfo.dwPdOffsIn2 >> 3),(ulong)(oCfgSlaveInfo.dwPdOffsIn2 & 7));
    }
    if (oCfgSlaveInfo.dwPdSizeOut2 != 0) {
      CAtEmLogging::LogMsg
                (poLog,"PD OUT2 Byte.Bit offset: %d.%d   Size: %d bits",
                 (ulong)(oCfgSlaveInfo.dwPdOffsOut2 >> 3),(ulong)(oCfgSlaveInfo.dwPdOffsOut2 & 7));
    }
    if (oCfgSlaveInfo.dwPdSizeIn3 != 0) {
      CAtEmLogging::LogMsg
                (poLog,"PD IN3  Byte.Bit offset: %d.%d   Size: %d bits",
                 (ulong)(oCfgSlaveInfo.dwPdOffsIn3 >> 3),(ulong)(oCfgSlaveInfo.dwPdOffsIn3 & 7));
    }
    if (oCfgSlaveInfo.dwPdSizeOut3 != 0) {
      CAtEmLogging::LogMsg
                (poLog,"PD OUT3 Byte.Bit offset: %d.%d   Size: %d bits",
                 (ulong)(oCfgSlaveInfo.dwPdOffsOut3 >> 3),(ulong)(oCfgSlaveInfo.dwPdOffsOut3 & 7));
    }
    if (oCfgSlaveInfo.dwPdSizeIn4 != 0) {
      CAtEmLogging::LogMsg
                (poLog,"PD IN4  Byte.Bit offset: %d.%d   Size: %d bits",
                 (ulong)(oCfgSlaveInfo.dwPdOffsIn4 >> 3),(ulong)(oCfgSlaveInfo.dwPdOffsIn4 & 7));
    }
    if (oCfgSlaveInfo.dwPdSizeOut4 != 0) {
      CAtEmLogging::LogMsg
                (poLog,"PD OUT4 Byte.Bit offset: %d.%d   Size: %d bits",
                 (ulong)(oCfgSlaveInfo.dwPdOffsOut4 >> 3),(ulong)(oCfgSlaveInfo.dwPdOffsOut4 & 7));
    }
    if (oCfgSlaveInfo.dwMbxSupportedProtocols == 0) {
      CAtEmLogging::LogMsg(poLog,"Mailbox supported  : No");
    }
    else {
      pcVar6 = "AoE ";
      if ((oCfgSlaveInfo.dwMbxSupportedProtocols & 1) == 0) {
        pcVar6 = "";
      }
      pcVar5 = "EoE ";
      if ((oCfgSlaveInfo.dwMbxSupportedProtocols & 2) == 0) {
        pcVar5 = "";
      }
      auVar12._0_4_ = -(uint)((oCfgSlaveInfo.dwMbxSupportedProtocols & 0x20) == 0);
      auVar12._4_4_ = -(uint)((oCfgSlaveInfo.dwMbxSupportedProtocols & 0x10) == 0);
      auVar12._8_4_ = -(uint)((oCfgSlaveInfo.dwMbxSupportedProtocols & 8) == 0);
      auVar12._12_4_ = -(uint)((oCfgSlaveInfo.dwMbxSupportedProtocols & 4) == 0);
      uVar3 = movmskps(oCfgSlaveInfo.dwMbxSupportedProtocols,auVar12);
      pcVar8 = "CoE ";
      if ((uVar3 & 8) != 0) {
        pcVar8 = "";
      }
      pcVar9 = "FoE ";
      if ((uVar3 & 4) != 0) {
        pcVar9 = "";
      }
      pcVar10 = "SoE ";
      if ((uVar3 & 2) != 0) {
        pcVar10 = "";
      }
      pcVar11 = "VoE ";
      if ((uVar3 & 1) != 0) {
        pcVar11 = "";
      }
      CAtEmLogging::LogMsg
                (poLog,"Protocol supported: %s%s%s%s%s%s",pcVar6,pcVar5,pcVar8,pcVar9,pcVar10,
                 pcVar11);
      CAtEmLogging::LogMsg
                (poLog,"Mailbox size   out: %06d / in: %06d",(ulong)oCfgSlaveInfo.dwMbxOutSize,
                 (ulong)oCfgSlaveInfo.dwMbxInSize);
      if (oCfgSlaveInfo.dwMbxOutSize2 != 0 || oCfgSlaveInfo.dwMbxInSize2 != 0) {
        CAtEmLogging::LogMsg(poLog,"BootMbx size   out: %06d / in: %06d");
      }
    }
    pcVar6 = "No";
    if (oCfgSlaveInfo.dwHCGroupIdx == 0) {
      pcVar6 = "Yes";
    }
    CAtEmLogging::LogMsg(poLog,"Slave is optional  : %s",pcVar6);
    pcVar6 = "Yes";
    if (oCfgSlaveInfo.bIsPresent == 0) {
      pcVar6 = "No";
    }
    CAtEmLogging::LogMsg(poLog,"Slave is present   : %s",pcVar6);
    pcVar6 = "Yes";
    if (oCfgSlaveInfo.bIsPresent == 0) {
      pcVar6 = "No";
    }
    CAtEmLogging::LogMsg(poLog,"HC group is present: %s",pcVar6);
    sVar7 = sVar7 + -1;
  } while (sVar7 != 1);
  CAtEmLogging::LogMsg(poLog,"==================================================");
  return;
}

Assistant:

EC_T_VOID PrintCfgSlavesInfo
    (EC_T_DWORD     dwInstanceID
    ,CAtEmLogging*  poLog)
{
EC_T_DWORD          dwRes           = EC_E_ERROR;
EC_T_WORD           wAutoIncAddress = 0;
EC_T_CFG_SLAVE_INFO oCfgSlaveInfo   = {0};

    LogMsg("==================================================");
    LogMsg("=== Config slaves ================================");
    LogMsg("==================================================");
    for (wAutoIncAddress = 0; wAutoIncAddress != 1; wAutoIncAddress--)
    {
        /* get config slave information */
        dwRes = emGetCfgSlaveInfo(dwInstanceID, EC_FALSE, wAutoIncAddress, &oCfgSlaveInfo);
        if (EC_E_NOERROR != dwRes)
        {
            break;
        }
        LogMsg("******************************************************************************");
        LogMsg("Slave ID............: 0x%08X", oCfgSlaveInfo.dwSlaveId);
        LogMsg("Bus AutoInc Address.: 0x%04x",       oCfgSlaveInfo.wAutoIncAddress, oCfgSlaveInfo.wAutoIncAddress);
        LogMsg("Bus Station Address.: 0x%04x (%4d)", oCfgSlaveInfo.wStationAddress, oCfgSlaveInfo.wStationAddress);
        LogMsg("Vendor ID...........: 0x%08X = %s", oCfgSlaveInfo.dwVendorId, SlaveVendorText((T_eEtherCAT_Vendor)oCfgSlaveInfo.dwVendorId));
        LogMsg("Product Code........: 0x%08X = %s", oCfgSlaveInfo.dwProductCode, SlaveProdCodeText((T_eEtherCAT_Vendor)oCfgSlaveInfo.dwVendorId, (T_eEtherCAT_ProductCode)oCfgSlaveInfo.dwProductCode));
        LogMsg("Revision............: 0x%08X   Serial Number: %d", oCfgSlaveInfo.dwRevisionNumber, oCfgSlaveInfo.dwSerialNumber);
        if (0 != oCfgSlaveInfo.dwPdSizeIn)
        {
            LogMsg( "PD IN   Byte.Bit offset: %d.%d   Size: %d bits", oCfgSlaveInfo.dwPdOffsIn/8,  oCfgSlaveInfo.dwPdOffsIn%8,  oCfgSlaveInfo.dwPdSizeIn );
        }
        if (0 != oCfgSlaveInfo.dwPdSizeOut)
        {
            LogMsg( "PD OUT  Byte.Bit offset: %d.%d   Size: %d bits", oCfgSlaveInfo.dwPdOffsOut/8, oCfgSlaveInfo.dwPdOffsOut%8, oCfgSlaveInfo.dwPdSizeOut );
        }
        if (0 != oCfgSlaveInfo.dwPdSizeIn2)
        {
            LogMsg( "PD IN2  Byte.Bit offset: %d.%d   Size: %d bits", oCfgSlaveInfo.dwPdOffsIn2/8,  oCfgSlaveInfo.dwPdOffsIn2%8,  oCfgSlaveInfo.dwPdSizeIn2 );
        }
        if (0 != oCfgSlaveInfo.dwPdSizeOut2)
        {
            LogMsg( "PD OUT2 Byte.Bit offset: %d.%d   Size: %d bits", oCfgSlaveInfo.dwPdOffsOut2/8, oCfgSlaveInfo.dwPdOffsOut2%8, oCfgSlaveInfo.dwPdSizeOut2 );
        }
        if (0 != oCfgSlaveInfo.dwPdSizeIn3)
        {
            LogMsg( "PD IN3  Byte.Bit offset: %d.%d   Size: %d bits", oCfgSlaveInfo.dwPdOffsIn3/8,  oCfgSlaveInfo.dwPdOffsIn3%8,  oCfgSlaveInfo.dwPdSizeIn3 );
        }
        if (0 != oCfgSlaveInfo.dwPdSizeOut3)
        {
            LogMsg( "PD OUT3 Byte.Bit offset: %d.%d   Size: %d bits", oCfgSlaveInfo.dwPdOffsOut3/8, oCfgSlaveInfo.dwPdOffsOut3%8, oCfgSlaveInfo.dwPdSizeOut3 );
        }
        if (0 != oCfgSlaveInfo.dwPdSizeIn4)
        {
            LogMsg( "PD IN4  Byte.Bit offset: %d.%d   Size: %d bits", oCfgSlaveInfo.dwPdOffsIn4/8,  oCfgSlaveInfo.dwPdOffsIn4%8,  oCfgSlaveInfo.dwPdSizeIn4 );
        }
        if (0 != oCfgSlaveInfo.dwPdSizeOut4)
        {
            LogMsg( "PD OUT4 Byte.Bit offset: %d.%d   Size: %d bits", oCfgSlaveInfo.dwPdOffsOut4/8, oCfgSlaveInfo.dwPdOffsOut4%8, oCfgSlaveInfo.dwPdSizeOut4 );
        }
        if (0 != oCfgSlaveInfo.dwMbxSupportedProtocols)
        {
            LogMsg( "Protocol supported: %s%s%s%s%s%s", (oCfgSlaveInfo.dwMbxSupportedProtocols & EC_MBX_PROTOCOL_AOE)?"AoE ":"",
                                                        (oCfgSlaveInfo.dwMbxSupportedProtocols & EC_MBX_PROTOCOL_EOE)?"EoE ":"",
                                                        (oCfgSlaveInfo.dwMbxSupportedProtocols & EC_MBX_PROTOCOL_COE)?"CoE ":"",
                                                        (oCfgSlaveInfo.dwMbxSupportedProtocols & EC_MBX_PROTOCOL_FOE)?"FoE ":"",
                                                        (oCfgSlaveInfo.dwMbxSupportedProtocols & EC_MBX_PROTOCOL_SOE)?"SoE ":"",
                                                        (oCfgSlaveInfo.dwMbxSupportedProtocols & EC_MBX_PROTOCOL_VOE)?"VoE ":"" );
            LogMsg( "Mailbox size   out: %06d / in: %06d", oCfgSlaveInfo.dwMbxOutSize, oCfgSlaveInfo.dwMbxInSize  );
            if ((oCfgSlaveInfo.dwMbxOutSize2 != 0) || (oCfgSlaveInfo.dwMbxInSize2 != 0))
            {
                LogMsg( "BootMbx size   out: %06d / in: %06d", oCfgSlaveInfo.dwMbxOutSize2, oCfgSlaveInfo.dwMbxInSize2 );
            }
        }
        else
        {
            LogMsg( "Mailbox supported  : No" );
        }
#if (defined INCLUDE_HOTCONNECT)
        LogMsg("Slave is optional  : %s", ((oCfgSlaveInfo.dwHCGroupIdx == 0) ? "Yes":"No"));
        LogMsg("Slave is present   : %s", (oCfgSlaveInfo.bIsPresent ? "Yes":"No"));
        LogMsg("HC group is present: %s", (oCfgSlaveInfo.bIsPresent ? "Yes":"No"));
#endif
    }
    LogMsg("==================================================");
    return;
}